

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O0

any_type_ref * __thiscall
boost::ext::di::v1_3_0::core::successful::any_type_ref::operator_cast_to_string(any_type_ref *this)

{
  undefined8 *in_RSI;
  type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_39;
  wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::ext::di::v1_3_0::wrappers::unique<boost::ext::di::v1_3_0::scopes::unique,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  any_type_ref<view,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>_>_>
  *this_local;
  
  this_local = (any_type_ref<view,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>_>_>
                *)this;
  injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>>
  ::
  create_successful_impl<boost::ext::di::v1_3_0::aux::integral_constant<bool,false>,std::__cxx11::string>
            (&local_38,
             (injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>>
              *)*in_RSI,&local_39);
  wrapper::operator_cast_to_string((wrapper *)this);
  wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::ext::di::v1_3_0::wrappers::unique<boost::ext::di::v1_3_0::scopes::unique,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~wrapper(&local_38);
  return this;
}

Assistant:

operator T() {
    return static_cast<const core::injector__<TInjector>&>(injector_).create_successful_impl(aux::type<T>{});
  }